

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

string * libcellml::printMapVariables
                   (string *__return_storage_ptr__,VariablePairPtr *variablePair,IdList *idList,
                   bool autoIds)

{
  element_type *peVar1;
  ulong uVar2;
  string *variable2;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  VariablePtr local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  string mappingId;
  string local_108;
  shared_ptr<libcellml::Variable> local_d8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_22;
  byte local_21;
  IdList *pIStack_20;
  bool autoIds_local;
  IdList *idList_local;
  VariablePairPtr *variablePair_local;
  string *mapVariables;
  
  local_22 = 0;
  variable2 = __return_storage_ptr__;
  local_21 = autoIds;
  pIStack_20 = idList;
  idList_local = (IdList *)variablePair;
  variablePair_local = (VariablePairPtr *)__return_storage_ptr__;
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)variablePair);
  VariablePair::variable1((VariablePair *)&local_d8);
  peVar1 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_d8);
  NamedEntity::name_abi_cxx11_(&local_c8,&peVar1->super_NamedEntity);
  std::operator+(&local_a8,"<map_variables variable_1=\"",&local_c8);
  std::operator+(&local_88,&local_a8,"\"");
  std::operator+(&local_68,&local_88," variable_2=\"");
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)idList_local);
  VariablePair::variable2((VariablePair *)((long)&mappingId.field_2 + 8));
  peVar1 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(mappingId.field_2._M_local_buf + 8));
  NamedEntity::name_abi_cxx11_(&local_108,&peVar1->super_NamedEntity);
  std::operator+(&local_48,&local_68,&local_108);
  std::operator+(__return_storage_ptr__,&local_48,"\"");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_108);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)((long)&mappingId.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_d8);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)idList_local);
  VariablePair::variable1((VariablePair *)local_148);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)idList_local);
  VariablePair::variable2((VariablePair *)&local_158);
  Variable::equivalenceMappingId_abi_cxx11_
            ((string *)local_138,(Variable *)local_148,&local_158,(VariablePtr *)variable2);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_158);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_148);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_198," id=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    std::operator+(&local_178,&local_198,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else if ((local_21 & 1) != 0) {
    makeUniqueId(&local_1f8,pIStack_20);
    std::operator+(&local_1d8," id=\"",&local_1f8);
    std::operator+(&local_1b8,&local_1d8,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/>");
  local_22 = 1;
  std::__cxx11::string::~string((string *)local_138);
  if ((local_22 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string printMapVariables(const VariablePairPtr &variablePair, IdList &idList, bool autoIds)
{
    std::string mapVariables = "<map_variables variable_1=\"" + variablePair->variable1()->name() + "\""
                               + " variable_2=\"" + variablePair->variable2()->name() + "\"";
    std::string mappingId = Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2());
    if (!mappingId.empty()) {
        mapVariables += " id=\"" + mappingId + "\"";
    } else if (autoIds) {
        mapVariables += " id=\"" + makeUniqueId(idList) + "\"";
    }
    mapVariables += "/>";
    return mapVariables;
}